

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

insert_return_type * __thiscall
phmap::priv::
btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
        *this,node_type *node)

{
  bool bVar1;
  slot_type *x;
  int *key;
  iterator iVar2;
  slot_type *local_50;
  undefined1 local_48 [8];
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
  res;
  node_type *node_local;
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
  *this_local;
  
  bVar1 = priv::node_handle_base::operator_cast_to_bool((node_handle_base *)node);
  if (bVar1) {
    x = CommonAccess::
        GetSlot<phmap::priv::node_handle<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,std::allocator<int>,void>>
                  (node);
    key = set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>::key(x);
    local_50 = CommonAccess::
               GetSlot<phmap::priv::node_handle<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,std::allocator<int>,void>>
                         (node);
    btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
    insert_unique<int*>((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
                         *)local_48,
                        (btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                         *)this,key,&local_50);
    if (((byte)res.first.position & 1) == 0) {
      (__return_storage_ptr__->position).node =
           (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            *)local_48;
      (__return_storage_ptr__->position).position = (int)res.first.node;
      __return_storage_ptr__->inserted = false;
      node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
      ::node_handle(&__return_storage_ptr__->node,node);
    }
    else {
      CommonAccess::
      Destroy<phmap::priv::node_handle<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>,std::allocator<int>,void>>
                (node);
      (__return_storage_ptr__->position).node =
           (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            *)local_48;
      (__return_storage_ptr__->position).position = (int)res.first.node;
      __return_storage_ptr__->inserted = true;
      node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
      ::node_handle(&__return_storage_ptr__->node);
    }
  }
  else {
    iVar2 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
            ::end(&this->
                   super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
                 );
    res._16_8_ = iVar2.node;
    (__return_storage_ptr__->position).node =
         (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          *)res._16_8_;
    (__return_storage_ptr__->position).position = iVar2.position;
    __return_storage_ptr__->inserted = false;
    node_handle<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>,_std::allocator<int>,_void>
    ::node_handle(&__return_storage_ptr__->node);
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type &&node) {
            if (!node) return {this->end(), false, node_type()};
            std::pair<iterator, bool> res =
                this->tree_.insert_unique(params_type::key(CommonAccess::GetSlot(node)),
                                          CommonAccess::GetSlot(node));
            if (res.second) {
                CommonAccess::Destroy(&node);
                return {res.first, true, node_type()};
            } else {
                return {res.first, false, std::move(node)};
            }
        }